

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int cmac_generate_subkeys(mbedtls_cipher_context_t *ctx,uchar *K1,uchar *K2)

{
  int iVar1;
  ulong ilen;
  size_t block_size;
  size_t olen;
  uchar L [16];
  int ret;
  uchar *K2_local;
  uchar *K1_local;
  mbedtls_cipher_context_t *ctx_local;
  
  L[0xc] = 0x92;
  L[0xd] = 0xff;
  L[0xe] = 0xff;
  L[0xf] = 0xff;
  mbedtls_platform_zeroize(&olen,0x10);
  ilen = (ulong)ctx->cipher_info->block_size;
  L._12_4_ = mbedtls_cipher_update(ctx,(uchar *)&olen,ilen,(uchar *)&olen,&block_size);
  if ((L._12_4_ == 0) && (L._12_4_ = cmac_multiply_by_u(K1,(uchar *)&olen,ilen), L._12_4_ == 0)) {
    L._12_4_ = cmac_multiply_by_u(K2,K1,ilen);
  }
  mbedtls_platform_zeroize(&olen,0x10);
  iVar1._0_1_ = L[0xc];
  iVar1._1_1_ = L[0xd];
  iVar1._2_1_ = L[0xe];
  iVar1._3_1_ = L[0xf];
  return iVar1;
}

Assistant:

static int cmac_generate_subkeys( mbedtls_cipher_context_t *ctx,
                                  unsigned char* K1, unsigned char* K2 )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char L[MBEDTLS_CIPHER_BLKSIZE_MAX];
    size_t olen, block_size;

    mbedtls_platform_zeroize( L, sizeof( L ) );

    block_size = ctx->cipher_info->block_size;

    /* Calculate Ek(0) */
    if( ( ret = mbedtls_cipher_update( ctx, L, block_size, L, &olen ) ) != 0 )
        goto exit;

    /*
     * Generate K1 and K2
     */
    if( ( ret = cmac_multiply_by_u( K1, L , block_size ) ) != 0 )
        goto exit;

    if( ( ret = cmac_multiply_by_u( K2, K1 , block_size ) ) != 0 )
        goto exit;

exit:
    mbedtls_platform_zeroize( L, sizeof( L ) );

    return( ret );
}